

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O1

int cram_decode_slice_mt(cram_fd *fd,cram_container *c,cram_slice *s,SAM_hdr *bfd)

{
  int iVar1;
  undefined8 *arg;
  
  if (fd->pool != (t_pool *)0x0) {
    arg = (undefined8 *)malloc(0x28);
    if (arg == (undefined8 *)0x0) {
      iVar1 = -1;
    }
    else {
      *arg = fd;
      arg[1] = c;
      arg[2] = s;
      arg[3] = bfd;
      iVar1 = t_pool_results_queue_sz(fd->rqueue);
      iVar1 = t_pool_dispatch2(fd->pool,fd->rqueue,cram_decode_slice_thread,arg,(uint)(iVar1 != 0));
      if (iVar1 == -1) {
        fd->job_pending = arg;
      }
      else {
        fd->job_pending = (void *)0x0;
      }
      iVar1 = 0;
    }
    return iVar1;
  }
  iVar1 = cram_decode_slice(fd,c,s,bfd);
  return iVar1;
}

Assistant:

int cram_decode_slice_mt(cram_fd *fd, cram_container *c, cram_slice *s,
			 SAM_hdr *bfd) {
    cram_decode_job *j;
    int nonblock;

    if (!fd->pool)
	return cram_decode_slice(fd, c, s, bfd);

    if (!(j = malloc(sizeof(*j))))
	return -1;

    j->fd = fd;
    j->c  = c;
    j->s  = s;
    j->h  = bfd;
    
    nonblock = t_pool_results_queue_sz(fd->rqueue) ? 1 : 0;

    if (-1 == t_pool_dispatch2(fd->pool, fd->rqueue, cram_decode_slice_thread,
			       j, nonblock)) {
	/* Would block */
	fd->job_pending = j;
    } else {
	fd->job_pending = NULL;
    }

    // flush too
    return 0;
}